

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O3

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:219:7)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:219:7)>
      *this)

{
  long *plVar1;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> aPStack_48 [3];
  undefined8 *local_18;
  long *local_10;
  
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            (aPStack_48,(this->func).pipelinePromise);
  plVar1 = local_10;
  if (local_10 != (long *)0x0) {
    local_10 = (long *)0x0;
    (**(code **)*local_18)(local_18,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  return;
}

Assistant:

void run() override {
    func();
  }